

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O2

size_t wasm::FunctionHasher::hashFunction(Function *func)

{
  size_t sVar1;
  code *local_30 [2];
  code *local_20;
  code *local_18;
  
  local_30[1] = (code *)0x0;
  local_30[0] = ExpressionAnalyzer::nothingHasher;
  local_18 = std::
             _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
             ::_M_manager;
  sVar1 = flexibleHashFunction(func,(ExprHasher *)local_30);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  return sVar1;
}

Assistant:

static size_t hashFunction(Function* func) {
    return flexibleHashFunction(func, ExpressionAnalyzer::nothingHasher);
  }